

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsproxywidget.cpp
# Opt level: O2

void __thiscall QGraphicsProxyWidget::hoverMoveEvent(QGraphicsProxyWidget *this)

{
  QGraphicsSceneHoverEvent *in_RSI;
  
  hoverMoveEvent(this + -0x10,in_RSI);
  return;
}

Assistant:

void QGraphicsProxyWidget::hoverMoveEvent(QGraphicsSceneHoverEvent *event)
{
    Q_D(QGraphicsProxyWidget);
#ifdef GRAPHICSPROXYWIDGET_DEBUG
    qDebug("QGraphicsProxyWidget::hoverMoveEvent");
#endif
    // Ignore events on the window frame.
    if (!d->widget || !rect().contains(event->pos())) {
        if (d->lastWidgetUnderMouse) {
            QApplicationPrivate::dispatchEnterLeave(nullptr, d->lastWidgetUnderMouse, event->screenPos());
            d->lastWidgetUnderMouse = nullptr;
        }
        return;
    }

    d->embeddedMouseGrabber = nullptr;
    d->sendWidgetMouseEvent(event);
}